

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Gia_ManBmcAddCnfNew(Bmc_Mna_t *p,int iStart,int iStop)

{
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int local_24;
  int i;
  Gia_Obj_t *pObj;
  int iStop_local;
  int iStart_local;
  Bmc_Mna_t *p_local;
  
  for (local_24 = iStart; local_24 < iStop; local_24 = local_24 + 1) {
    pObj_00 = Gia_ManPo(p->pFrames,local_24);
    pGVar1 = Gia_ObjFanin0(pObj_00);
    pGVar2 = Gia_ManConst0(p->pFrames);
    if (pGVar1 != pGVar2) {
      Gia_ManBmcAddCnfNew_rec(p,pObj_00);
    }
  }
  return;
}

Assistant:

void Gia_ManBmcAddCnfNew( Bmc_Mna_t * p, int iStart, int iStop )
{
    Gia_Obj_t * pObj;
    int i;
    for ( i = iStart; i < iStop; i++ )
    {
        pObj = Gia_ManPo(p->pFrames, i);
        if ( Gia_ObjFanin0(pObj) == Gia_ManConst0(p->pFrames) )
            continue;
        Gia_ManBmcAddCnfNew_rec( p, pObj );
    }
}